

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O1

void __thiscall QPaintEngine::drawLines(QPaintEngine *this,QLine *lines,int lineCount)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  LineF fl [256];
  double dStack_2048;
  code *pcStack_2040;
  double local_2038 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcStack_2040 = (code *)0x3b7f9b;
  memset(local_2038,0xff,0x2000);
  if (lineCount != 0) {
    do {
      uVar4 = 0;
      if (0 < lineCount) {
        uVar2 = lineCount - 1;
        if (0xfe < uVar2) {
          uVar2 = 0xff;
        }
        lVar3 = 8;
        uVar4 = 0;
        do {
          uVar1 = *(undefined8 *)((long)lines + lVar3 + -8);
          *(double *)((long)&dStack_2048 + lVar3 * 2) = (double)(int)uVar1;
          *(double *)((long)&pcStack_2040 + lVar3 * 2) = (double)(int)((ulong)uVar1 >> 0x20);
          uVar1 = *(undefined8 *)((long)&(lines->pt1).xp.m_i + lVar3);
          *(double *)((long)local_2038 + lVar3 * 2) = (double)(int)uVar1;
          *(double *)((long)local_2038 + lVar3 * 2 + 8) = (double)(int)((ulong)uVar1 >> 0x20);
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar2 + 1 != uVar4);
      }
      pcStack_2040 = (code *)0x3b7fef;
      (*this->_vptr_QPaintEngine[8])(this,local_2038,uVar4 & 0xffffffff);
      lines = lines + (uVar4 & 0xffffffff);
      lineCount = lineCount - (int)uVar4;
    } while (lineCount != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    pcStack_2040 = drawRects;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngine::drawLines(const QLine *lines, int lineCount)
{
    struct PointF {
        qreal x;
        qreal y;
    };
    struct LineF {
        PointF p1;
        PointF p2;
    };
    Q_ASSERT(sizeof(PointF) == sizeof(QPointF));
    Q_ASSERT(sizeof(LineF) == sizeof(QLineF));
    LineF fl[256];
    while (lineCount) {
        int i = 0;
        while (i < lineCount && i < 256) {
            fl[i].p1.x = lines[i].x1();
            fl[i].p1.y = lines[i].y1();
            fl[i].p2.x = lines[i].x2();
            fl[i].p2.y = lines[i].y2();
            ++i;
        }
        drawLines((QLineF *)(void *)fl, i);
        lines += i;
        lineCount -= i;
    }
}